

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLoadUnstructured.hpp
# Opt level: O1

void testApproxL2<makeTests(TasGrid::TypeAcceleration,int)::__16>
               (TasmanianSparseGrid *grid,uint param_2)

{
  _Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false> _Var1;
  pointer pdVar2;
  undefined8 uVar3;
  TasmanianSparseGrid *grid_00;
  ostream *poVar4;
  runtime_error *this;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  vector<double,_std::allocator<double>_> x;
  vector<double,_std::allocator<double>_> surrogate;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  data;
  vector<double,_std::allocator<double>_> transform_b;
  vector<double,_std::allocator<double>_> transform_a;
  minstd_rand park_miller;
  uniform_real_distribution<double> unif;
  allocator_type local_129;
  vector<double,_std::allocator<double>_> local_128;
  _Any_data local_108;
  pointer local_f8;
  double local_e8;
  vector<double,_std::allocator<double>_> local_e0;
  vector<double,_std::allocator<double>_> local_c8;
  TasmanianSparseGrid *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  vector<double,_std::allocator<double>_> local_88;
  vector<double,_std::allocator<double>_> local_68;
  double local_48;
  double local_40 [2];
  
  local_108._M_unused._M_object = (void *)0xbfe0000000000000;
  local_108._8_8_ = (_func_void *)0xbfe0000000000000;
  local_f8 = (pointer)0xbfe0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_108;
  std::vector<double,_std::allocator<double>_>::vector(&local_e0,__l,(allocator_type *)&local_88);
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fe6666666666666;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3fe6666666666666;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fe6666666666666;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_68;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_a8,__l_00,
             (allocator_type *)&local_128);
  TasGrid::TasmanianSparseGrid::setDomainTransform((vector *)grid,(vector *)&local_e0);
  if (local_a8._M_unused._M_object != (void *)0x0) {
    operator_delete(local_a8._M_unused._M_object,(long)local_98 - local_a8._0_8_);
  }
  if (local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  _Var1._M_head_impl =
       (grid->base)._M_t.
       super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
       ._M_t.
       super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
       .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (BaseCanonicalGrid *)0x0) {
    lVar7 = 0;
    lVar8 = 0;
  }
  else {
    lVar7 = (long)*(int *)(_Var1._M_head_impl + 0x10);
    lVar8 = (long)*(int *)(_Var1._M_head_impl + 0x14);
  }
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  TasGrid::TasmanianSparseGrid::getDomainTransform((vector *)grid,(vector *)&local_68);
  local_a8._8_8_ = &local_48;
  local_48 = 2.07507571253324e-322;
  local_a8._M_unused._M_object = local_40;
  local_40[0] = 0.0;
  local_40[1] = 1.0;
  pcStack_90 = std::
               _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/testLoadUnstructured.hpp:74:81)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/testLoadUnstructured.hpp:74:81)>
             ::_M_manager;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::function<double_()>::function
            ((function<double_()> *)&local_108,(function<double_()> *)&local_a8);
  TasDREAM::genUniformSamples
            (&local_68,&local_88,param_2,&local_128,(function<double_()> *)&local_108);
  if (local_f8 != (pointer)0x0) {
    (*(code *)local_f8)(&local_108,&local_108,3);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  local_b0 = grid;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_108,(int)param_2 * lVar8,&local_129);
  if (0 < (int)param_2) {
    uVar5 = (ulong)param_2;
    local_e8 = (double)(lVar8 << 3);
    lVar6 = 0x10;
    lVar8 = 0x10;
    do {
      uVar3 = local_108._M_unused._0_8_;
      pdVar2 = local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar10 = *(double *)
                ((long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar6 + -8) + -0.3;
      dVar10 = exp((*(double *)
                     ((long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar6) + 0.4) *
                   -(*(double *)
                      ((long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar6 + -0x10) + -0.1) * dVar10 *
                   dVar10);
      *(double *)(uVar3 + lVar8 + -0x10) = dVar10;
      dVar10 = exp((*(double *)((long)pdVar2 + lVar6) + 0.3) *
                   (*(double *)((long)pdVar2 + lVar6 + -8) + -0.2) *
                   -(*(double *)((long)pdVar2 + lVar6 + -0x10) + -0.1));
      dVar9 = local_e8;
      *(double *)(uVar3 + lVar8 + -8) = dVar10;
      dVar10 = exp((*(double *)((long)pdVar2 + lVar6) + -0.1) *
                   (*(double *)((long)pdVar2 + lVar6 + -8) + 0.1) *
                   -(*(double *)((long)pdVar2 + lVar6 + -0x10) + 0.3));
      *(double *)(uVar3 + lVar8) = dVar10;
      lVar8 = lVar8 + (long)dVar9;
      lVar6 = lVar6 + lVar7 * 8;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  grid_00 = local_b0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_f8;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_108._8_8_;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_108._M_unused._0_8_;
  local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage;
  local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  TasGrid::loadUnstructuredDataL2(&local_e0,&local_c8,1e-08,grid_00);
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f8 = (pointer)0x0;
  TasGrid::TasmanianSparseGrid::evaluateBatch<double>((vector *)grid_00,(vector *)&local_e0);
  lVar7 = std::cout;
  if ((long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start == local_108._8_8_ - local_108._0_8_) {
    if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      dVar10 = 0.0;
    }
    else {
      lVar8 = (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      dVar10 = 0.0;
      lVar6 = 0;
      do {
        dVar9 = ABS(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar6] -
                    *(double *)((long)local_108._M_unused._0_8_ + lVar6 * 8));
        if (dVar10 <= dVar9) {
          dVar10 = dVar9;
        }
        lVar6 = lVar6 + 1;
      } while (lVar8 + (ulong)(lVar8 == 0) != lVar6);
    }
  }
  else {
    dVar10 = 1e+20;
  }
  if (0.0001 < dVar10) {
    *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar7 + -0x18)) = 10;
    local_e8 = dVar10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed approximate unstructured construction\n",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Observed error: ",0x10);
    poVar4 = std::ostream::_M_insert<double>(local_e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  tolerance: ",0xd);
    poVar4 = std::ostream::_M_insert<double>(0.0001);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    TasGrid::TasmanianSparseGrid::printStats((ostream *)local_b0);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"test failed");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_108._M_unused._M_object != (void *)0x0) {
    operator_delete(local_108._M_unused._M_object,(long)local_f8 - local_108._0_8_);
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void testApproxL2(TasmanianSparseGrid &&grid, CallableModel model, int num_samples, double tolerance){
    grid.setDomainTransform({-0.5, -0.5, -0.5,}, {0.7, 0.7, 0.7});

    auto data = generateRandomData(grid, model, num_samples);
    loadUnstructuredDataL2(data.first, data.second, 1.E-8, grid);

    std::vector<double> surrogate;
    grid.evaluateBatch(data.first, surrogate);

    double err = vecDifference(data.second, surrogate);
    if (err > tolerance){
        std::cout << std::scientific;
        std::cout.precision(10);
        cout << "Failed approximate unstructured construction\n";
        cout << "Observed error: " << err << "  tolerance: " << tolerance << "\n";
        grid.printStats();
        throw std::runtime_error("test failed");
    }
}